

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O2

PropertyName * __thiscall
Jinx::Impl::Library::GetPropertyName
          (PropertyName *__return_storage_ptr__,Library *this,String *name)

{
  iterator iVar1;
  
  std::mutex::lock(&this->m_propertyMutex);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
          ::find(&(this->m_propertyNameTable)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->m_propertyNameTable)._M_t._M_impl.super__Rb_tree_header) {
    PropertyName::PropertyName(__return_storage_ptr__);
  }
  else {
    PropertyName::PropertyName(__return_storage_ptr__,(PropertyName *)(iVar1._M_node + 2));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
  return __return_storage_ptr__;
}

Assistant:

inline_t PropertyName Library::GetPropertyName(const String & name)
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		auto itr = m_propertyNameTable.find(name);
		if (itr == m_propertyNameTable.end())
			return PropertyName();
		return itr->second;
	}